

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_1D_mri.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  N_Vector y_00;
  SUNContext ctx;
  sunrealtype *data;
  UserData udata;
  sunindextype i;
  sunindextype NEQ;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nffi;
  long nffe;
  long nfsi;
  long nfse;
  long netf;
  long nstf_a;
  long nstf;
  long nsts;
  int iout;
  FILE *WFID;
  FILE *VFID;
  FILE *UFID;
  FILE *FID;
  sunrealtype w;
  sunrealtype v;
  sunrealtype u;
  sunrealtype tout;
  sunrealtype dTout;
  sunrealtype t;
  MRIStepInnerStepper inner_stepper;
  void *inner_arkode_mem;
  void *arkode_mem;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector wmask;
  N_Vector vmask;
  N_Vector umask;
  N_Vector y;
  int retval;
  sunrealtype hs;
  sunrealtype abstol;
  sunrealtype reltol;
  sunrealtype ep;
  sunrealtype c;
  sunrealtype b;
  sunrealtype a;
  sunindextype N;
  int Nvar;
  int Nt;
  sunrealtype Tf;
  sunrealtype T0;
  int in_stack_fffffffffffffe3c;
  char *in_stack_fffffffffffffe40;
  void *in_stack_fffffffffffffe48;
  double local_1b0;
  double local_1a8;
  undefined8 local_1a0;
  undefined8 *local_198;
  long *local_190;
  void *in_stack_fffffffffffffe78;
  long lVar2;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined1 local_148 [8];
  undefined1 local_140 [8];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  int local_10c;
  FILE *local_108;
  FILE *local_100;
  FILE *local_f8;
  FILE *local_f0;
  void *local_e8;
  double local_e0;
  double local_d8;
  char *local_d0;
  double local_c8;
  double local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  int local_6c;
  double local_68;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  double local_48;
  long local_40;
  long local_38;
  long local_30;
  int local_28;
  int local_24;
  char *local_20;
  double local_18;
  int local_4;
  
  local_4 = 0;
  local_18 = 0.0;
  local_20 = (char *)0x4024000000000000;
  local_24 = 100;
  local_28 = 3;
  local_30 = 200;
  local_38 = 0x3ff0000000000000;
  local_40 = 0x400c000000000000;
  local_48 = 0.25;
  local_50 = 0x3eb0c6f7a0b5ed8d;
  local_58 = 0x3eb0c6f7a0b5ed8d;
  local_60 = 0x3ddb7cdfd9d7bdbb;
  local_78 = 0;
  local_80 = 0;
  local_88 = 0;
  local_90 = 0;
  local_98 = 0;
  local_a0 = 0;
  local_a8 = 0;
  local_b0 = 0;
  local_b8 = 0;
  local_190 = (long *)0x0;
  local_198 = (undefined8 *)0x0;
  local_6c = SUNContext_Create(0,&local_1a0);
  iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c
                      );
  if (iVar1 == 0) {
    local_190 = (long *)malloc(0x30);
    iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                         in_stack_fffffffffffffe3c);
    if (iVar1 == 0) {
      *local_190 = local_30;
      local_190[2] = local_38;
      local_190[3] = local_40;
      local_190[4] = (long)local_48;
      local_190[5] = local_50;
      local_190[1] = (long)(1.0 / (double)local_30);
      y_00 = (N_Vector)((long)local_28 * *local_190);
      local_68 = ((double)local_190[1] / ABS(local_48)) * 0.5;
      printf("\n1D Advection-Reaction example problem:\n");
      printf("    N = %li,  NEQ = %li\n",*local_190,y_00);
      printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",local_190[2],local_190[3],
             (int)local_190[5]);
      printf("    advection coefficient:  c = %g\n",local_190[4]);
      printf("    reltol = %.1e,  abstol = %.1e\n\n",local_58,local_60);
      local_78 = N_VNew_Serial(y_00,local_1a0);
      iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                           in_stack_fffffffffffffe3c);
      if (iVar1 == 0) {
        local_6c = SetIC(y_00,in_stack_fffffffffffffe78);
        iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                             in_stack_fffffffffffffe3c);
        if (iVar1 == 0) {
          local_80 = N_VClone(local_78);
          iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                               in_stack_fffffffffffffe3c);
          if (iVar1 == 0) {
            local_88 = N_VClone(local_78);
            iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                 in_stack_fffffffffffffe3c);
            if (iVar1 == 0) {
              local_90 = N_VClone(local_78);
              iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                   in_stack_fffffffffffffe3c);
              if (iVar1 == 0) {
                N_VConst(local_80);
                local_198 = (undefined8 *)N_VGetArrayPointer(local_80);
                iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                     in_stack_fffffffffffffe3c);
                if (iVar1 == 0) {
                  for (lVar2 = 0; lVar2 < local_30; lVar2 = lVar2 + 1) {
                    *(undefined8 *)((long)local_198 + lVar2 * 0x18) = 0x3ff0000000000000;
                  }
                  N_VConst(local_88);
                  local_198 = (undefined8 *)N_VGetArrayPointer(local_88);
                  iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                       in_stack_fffffffffffffe3c);
                  if (iVar1 == 0) {
                    for (lVar2 = 0; lVar2 < local_30; lVar2 = lVar2 + 1) {
                      *(undefined8 *)((long)local_198 + 8 + lVar2 * 0x18) = 0x3ff0000000000000;
                    }
                    N_VConst(local_90);
                    local_198 = (undefined8 *)N_VGetArrayPointer(local_90);
                    iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                         in_stack_fffffffffffffe3c);
                    if (iVar1 == 0) {
                      for (lVar2 = 0; lVar2 < local_30; lVar2 = lVar2 + 1) {
                        *(undefined8 *)((long)local_198 + 0x10 + lVar2 * 0x18) = 0x3ff0000000000000;
                      }
                      local_98 = SUNBandMatrix(y_00,4,4,local_1a0);
                      iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                           in_stack_fffffffffffffe3c);
                      if (iVar1 == 0) {
                        local_a0 = SUNLinSol_Band(local_78,local_98,local_1a0);
                        iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                             in_stack_fffffffffffffe3c);
                        if (iVar1 == 0) {
                          local_b0 = ARKStepCreate(local_18,0,ff,local_78,local_1a0);
                          iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                               in_stack_fffffffffffffe3c);
                          if (iVar1 == 0) {
                            local_6c = ARKodeSetUserData(local_b0,local_190);
                            iVar1 = check_retval(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40
                                                 ,in_stack_fffffffffffffe3c);
                            if (iVar1 == 0) {
                              local_6c = ARKStepSetTableNum(local_b0,0x68,0xffffffff);
                              iVar1 = check_retval(in_stack_fffffffffffffe48,
                                                   in_stack_fffffffffffffe40,
                                                   in_stack_fffffffffffffe3c);
                              if (iVar1 == 0) {
                                local_6c = ARKodeSStolerances(local_58,local_60,local_b0);
                                iVar1 = check_retval(in_stack_fffffffffffffe48,
                                                     in_stack_fffffffffffffe40,
                                                     in_stack_fffffffffffffe3c);
                                if (iVar1 == 0) {
                                  local_6c = ARKodeSetLinearSolver(local_b0,local_a0,local_98);
                                  iVar1 = check_retval(in_stack_fffffffffffffe48,
                                                       in_stack_fffffffffffffe40,
                                                       in_stack_fffffffffffffe3c);
                                  if (iVar1 == 0) {
                                    local_6c = ARKodeSetJacFn(local_b0,Jf);
                                    iVar1 = check_retval(in_stack_fffffffffffffe48,
                                                         in_stack_fffffffffffffe40,
                                                         in_stack_fffffffffffffe3c);
                                    if (iVar1 == 0) {
                                      local_6c = ARKStepCreateMRIStepInnerStepper
                                                           (local_b0,&local_b8);
                                      iVar1 = check_retval(in_stack_fffffffffffffe48,
                                                           in_stack_fffffffffffffe40,
                                                           in_stack_fffffffffffffe3c);
                                      if (iVar1 == 0) {
                                        local_a8 = MRIStepCreate(local_18,fs,0,local_78,local_b8,
                                                                 local_1a0);
                                        iVar1 = check_retval(in_stack_fffffffffffffe48,
                                                             in_stack_fffffffffffffe40,
                                                             in_stack_fffffffffffffe3c);
                                        if (iVar1 == 0) {
                                          local_6c = ARKodeSetUserData(local_a8,local_190);
                                          iVar1 = check_retval(in_stack_fffffffffffffe48,
                                                               in_stack_fffffffffffffe40,
                                                               in_stack_fffffffffffffe3c);
                                          if (iVar1 == 0) {
                                            local_6c = ARKodeSetFixedStep(local_68,local_a8);
                                            iVar1 = check_retval(in_stack_fffffffffffffe48,
                                                                 in_stack_fffffffffffffe40,
                                                                 in_stack_fffffffffffffe3c);
                                            if (iVar1 == 0) {
                                              local_f0 = fopen("mesh.txt","w");
                                              for (lVar2 = 0; lVar2 < local_30 + 1;
                                                  lVar2 = lVar2 + 1) {
                                                fprintf(local_f0,"  %.16e\n",
                                                        (double)local_190[1] * (double)lVar2);
                                              }
                                              fclose(local_f0);
                                              local_f8 = fopen("u.txt","w");
                                              local_100 = fopen("v.txt","w");
                                              local_108 = fopen("w.txt","w");
                                              local_198 = (undefined8 *)N_VGetArrayPointer(local_78)
                                              ;
                                              iVar1 = check_retval(in_stack_fffffffffffffe48,
                                                                   in_stack_fffffffffffffe40,
                                                                   in_stack_fffffffffffffe3c);
                                              if (iVar1 == 0) {
                                                for (lVar2 = 0; lVar2 < local_30; lVar2 = lVar2 + 1)
                                                {
                                                  fprintf(local_f8," %.16e",local_198[lVar2 * 3]);
                                                }
                                                fprintf(local_f8," %.16e",*local_198);
                                                fprintf(local_f8,"\n");
                                                for (lVar2 = 0; lVar2 < local_30; lVar2 = lVar2 + 1)
                                                {
                                                  fprintf(local_100," %.16e",
                                                          local_198[lVar2 * 3 + 1]);
                                                }
                                                fprintf(local_100," %.16e",local_198[1]);
                                                fprintf(local_100,"\n");
                                                for (lVar2 = 0; lVar2 < local_30; lVar2 = lVar2 + 1)
                                                {
                                                  fprintf(local_108," %.16e",
                                                          local_198[lVar2 * 3 + 2]);
                                                }
                                                fprintf(local_108," %.16e",local_198[2]);
                                                fprintf(local_108,"\n");
                                                local_c0 = local_18;
                                                local_c8 = ((double)local_20 - local_18) /
                                                           (double)local_24;
                                                local_d0 = (char *)(local_18 + local_c8);
                                                printf(
                                                  "        t      ||u||_rms   ||v||_rms   ||w||_rms\n"
                                                  );
                                                printf(
                                                  "   ----------------------------------------------\n"
                                                  );
                                                for (local_10c = 0; local_10c < local_24;
                                                    local_10c = local_10c + 1) {
                                                  local_6c = ARKodeEvolve(local_d0,local_a8,local_78
                                                                          ,&local_c0,1);
                                                  iVar1 = check_retval(in_stack_fffffffffffffe48,
                                                                       in_stack_fffffffffffffe40,
                                                                       in_stack_fffffffffffffe3c);
                                                  if (iVar1 != 0) break;
                                                  local_d8 = (double)N_VWL2Norm(local_78,local_80);
                                                  if (0.0 < (local_d8 * local_d8) / (double)local_30
                                                     ) {
                                                    local_1a8 = sqrt((local_d8 * local_d8) /
                                                                     (double)local_30);
                                                  }
                                                  else {
                                                    local_1a8 = 0.0;
                                                  }
                                                  local_d8 = local_1a8;
                                                  local_e0 = (double)N_VWL2Norm(local_78,local_88);
                                                  if (0.0 < (local_e0 * local_e0) / (double)local_30
                                                     ) {
                                                    local_1b0 = sqrt((local_e0 * local_e0) /
                                                                     (double)local_30);
                                                  }
                                                  else {
                                                    local_1b0 = 0.0;
                                                  }
                                                  local_e0 = local_1b0;
                                                  local_e8 = (void *)N_VWL2Norm(local_78,local_90);
                                                  if (0.0 < ((double)local_e8 * (double)local_e8) /
                                                            (double)local_30) {
                                                    in_stack_fffffffffffffe48 =
                                                         (void *)sqrt(((double)local_e8 *
                                                                      (double)local_e8) /
                                                                      (double)local_30);
                                                  }
                                                  else {
                                                    in_stack_fffffffffffffe48 = (void *)0x0;
                                                  }
                                                  local_e8 = in_stack_fffffffffffffe48;
                                                  printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",
                                                         local_c0,local_d8,SUB84(local_e0,0),
                                                         in_stack_fffffffffffffe48);
                                                  for (lVar2 = 0; lVar2 < local_30;
                                                      lVar2 = lVar2 + 1) {
                                                    fprintf(local_f8," %.16e",local_198[lVar2 * 3]);
                                                  }
                                                  fprintf(local_f8," %.16e",*local_198);
                                                  fprintf(local_f8,"\n");
                                                  for (lVar2 = 0; lVar2 < local_30;
                                                      lVar2 = lVar2 + 1) {
                                                    fprintf(local_100," %.16e",
                                                            local_198[lVar2 * 3 + 1]);
                                                  }
                                                  fprintf(local_100," %.16e",local_198[1]);
                                                  fprintf(local_100,"\n");
                                                  for (lVar2 = 0; lVar2 < local_30;
                                                      lVar2 = lVar2 + 1) {
                                                    fprintf(local_108," %.16e",
                                                            local_198[lVar2 * 3 + 2]);
                                                  }
                                                  fprintf(local_108," %.16e",local_198[2]);
                                                  fprintf(local_108,"\n");
                                                  in_stack_fffffffffffffe40 =
                                                       (char *)(local_c8 + (double)local_d0);
                                                  if ((double)local_20 <
                                                      (double)in_stack_fffffffffffffe40) {
                                                    in_stack_fffffffffffffe40 = local_20;
                                                  }
                                                  local_d0 = in_stack_fffffffffffffe40;
                                                }
                                                printf(
                                                  "   ----------------------------------------------\n"
                                                  );
                                                fclose(local_f8);
                                                fclose(local_100);
                                                fclose(local_108);
                                                local_6c = ARKodeGetNumSteps(local_a8,&local_118);
                                                check_retval(in_stack_fffffffffffffe48,
                                                             in_stack_fffffffffffffe40,
                                                             in_stack_fffffffffffffe3c);
                                                local_6c = MRIStepGetNumRhsEvals
                                                                     (local_a8,&local_138,local_140)
                                                ;
                                                check_retval(in_stack_fffffffffffffe48,
                                                             in_stack_fffffffffffffe40,
                                                             in_stack_fffffffffffffe3c);
                                                local_6c = ARKodeGetNumSteps(local_b0,&local_120);
                                                check_retval(in_stack_fffffffffffffe48,
                                                             in_stack_fffffffffffffe40,
                                                             in_stack_fffffffffffffe3c);
                                                local_6c = ARKodeGetNumStepAttempts
                                                                     (local_b0,&local_128);
                                                check_retval(in_stack_fffffffffffffe48,
                                                             in_stack_fffffffffffffe40,
                                                             in_stack_fffffffffffffe3c);
                                                local_6c = ARKStepGetNumRhsEvals
                                                                     (local_b0,local_148,&local_150)
                                                ;
                                                check_retval(in_stack_fffffffffffffe48,
                                                             in_stack_fffffffffffffe40,
                                                             in_stack_fffffffffffffe3c);
                                                local_6c = ARKodeGetNumLinSolvSetups
                                                                     (local_b0,&local_158);
                                                check_retval(in_stack_fffffffffffffe48,
                                                             in_stack_fffffffffffffe40,
                                                             in_stack_fffffffffffffe3c);
                                                local_6c = ARKodeGetNumErrTestFails
                                                                     (local_b0,&local_130);
                                                check_retval(in_stack_fffffffffffffe48,
                                                             in_stack_fffffffffffffe40,
                                                             in_stack_fffffffffffffe3c);
                                                local_6c = ARKodeGetNumNonlinSolvIters
                                                                     (local_b0,&local_170);
                                                check_retval(in_stack_fffffffffffffe48,
                                                             in_stack_fffffffffffffe40,
                                                             in_stack_fffffffffffffe3c);
                                                local_6c = ARKodeGetNumNonlinSolvConvFails
                                                                     (local_b0,&local_178);
                                                check_retval(in_stack_fffffffffffffe48,
                                                             in_stack_fffffffffffffe40,
                                                             in_stack_fffffffffffffe3c);
                                                local_6c = ARKodeGetNumJacEvals(local_b0,&local_160)
                                                ;
                                                check_retval(in_stack_fffffffffffffe48,
                                                             in_stack_fffffffffffffe40,
                                                             in_stack_fffffffffffffe3c);
                                                local_6c = ARKodeGetNumLinRhsEvals
                                                                     (local_b0,&local_168);
                                                check_retval(in_stack_fffffffffffffe48,
                                                             in_stack_fffffffffffffe40,
                                                             in_stack_fffffffffffffe3c);
                                                printf("\nFinal Solver Statistics:\n");
                                                printf("   Slow Steps: nsts = %li\n",local_118);
                                                printf(
                                                  "   Fast Steps: nstf = %li (attempted = %li)\n",
                                                  local_120,local_128);
                                                printf("   Total RHS evals:  Fs = %li,  Ff = %li\n",
                                                       local_138,local_150);
                                                printf(
                                                  "   Total number of fast error test failures = %li\n"
                                                  ,local_130);
                                                printf("   Total linear solver setups = %li\n",
                                                       local_158);
                                                printf(
                                                  "   Total RHS evals for setting up the linear system = %li\n"
                                                  ,local_168);
                                                printf(
                                                  "   Total number of Jacobian evaluations = %li\n",
                                                  local_160);
                                                printf(
                                                  "   Total number of Newton iterations = %li\n",
                                                  local_170);
                                                printf(
                                                  "   Total number of nonlinear solver convergence failures = %li\n"
                                                  ,local_178);
                                                free(local_190);
                                                ARKodeFree(&local_b0);
                                                MRIStepInnerStepper_Free(&local_b8);
                                                ARKodeFree(&local_a8);
                                                SUNLinSolFree(local_a0);
                                                SUNMatDestroy(local_98);
                                                N_VDestroy(local_78);
                                                N_VDestroy(local_80);
                                                N_VDestroy(local_88);
                                                N_VDestroy(local_90);
                                                SUNContext_Free(&local_1a0);
                                                local_4 = 0;
                                              }
                                              else {
                                                local_4 = 1;
                                              }
                                            }
                                            else {
                                              local_4 = 1;
                                            }
                                          }
                                          else {
                                            local_4 = 1;
                                          }
                                        }
                                        else {
                                          local_4 = 1;
                                        }
                                      }
                                      else {
                                        local_4 = 1;
                                      }
                                    }
                                    else {
                                      local_4 = 1;
                                    }
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);  /* initial time                    */
  sunrealtype Tf     = SUN_RCONST(10.0); /* final time                      */
  int Nt             = 100;              /* total number of output times    */
  int Nvar           = 3;                /* number of solution fields       */
  sunindextype N     = 200;              /* spatial mesh size (N intervals) */
  sunrealtype a      = SUN_RCONST(1.0);  /* problem parameters              */
  sunrealtype b      = SUN_RCONST(3.5);
  sunrealtype c      = SUN_RCONST(0.25);
  sunrealtype ep     = SUN_RCONST(1.0e-6); /* stiffness parameter */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances          */
  sunrealtype abstol = SUN_RCONST(1.0e-10);

  /* general problem variables */
  sunrealtype hs;                           /* slow step size                 */
  int retval;                               /* reusable return flag           */
  N_Vector y                        = NULL; /* empty solution vector          */
  N_Vector umask                    = NULL; /* empty mask vectors             */
  N_Vector vmask                    = NULL;
  N_Vector wmask                    = NULL;
  SUNMatrix A                       = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS                = NULL; /* empty linear solver structure  */
  void* arkode_mem                  = NULL; /* empty ARKode memory structure  */
  void* inner_arkode_mem            = NULL; /* empty ARKode memory structure  */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper                  */
  sunrealtype t, dTout, tout;               /* current/output time data       */
  sunrealtype u, v, w;                      /* temp data values               */
  FILE *FID, *UFID, *VFID, *WFID;           /* output file pointers           */
  int iout;                                 /* output counter                 */
  long int nsts, nstf, nstf_a, netf;        /* step stats                     */
  long int nfse, nfsi, nffe, nffi;          /* RHS stats                      */
  long int nsetups, nje, nfeLS;             /* linear solver stats            */
  long int nni, ncfn;                       /* nonlinear solver stats         */
  sunindextype NEQ;                         /* number of equations            */
  sunindextype i;                           /* counter                        */
  UserData udata    = NULL;                 /* user data pointer              */
  sunrealtype* data = NULL;                 /* array for vector data          */

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* allocate udata structure */
  udata = (UserData)malloc(sizeof(*udata));
  if (check_retval((void*)udata, "malloc", 2)) { return 1; }

  /* store the inputs in the UserData structure */
  udata->N  = N;
  udata->a  = a;
  udata->b  = b;
  udata->c  = c;
  udata->ep = ep;
  udata->dx = SUN_RCONST(1.0) / N; /* periodic BC, divide by N not N-1 */

  /* set total allocated vector length */
  NEQ = Nvar * udata->N;

  /* set the slow step size */
  hs = SUN_RCONST(0.5) * (udata->dx / SUNRabs(c));

  /* Initial problem output */
  printf("\n1D Advection-Reaction example problem:\n");
  printf("    N = %li,  NEQ = %li\n", (long int)udata->N, (long int)NEQ);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         udata->a, udata->b, udata->ep);
  printf("    advection coefficient:  c = %" GSYM "\n", udata->c);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Create solution vector */
  y = N_VNew_Serial(NEQ, ctx); /* Create vector for solution */
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }

  /* Set initial condition */
  retval = SetIC(y, udata);
  if (check_retval(&retval, "SetIC", 1)) { return 1; }

  /* Create vector masks */
  umask = N_VClone(y);
  if (check_retval((void*)umask, "N_VClone", 0)) { return 1; }

  vmask = N_VClone(y);
  if (check_retval((void*)vmask, "N_VClone", 0)) { return 1; }

  wmask = N_VClone(y);
  if (check_retval((void*)wmask, "N_VClone", 0)) { return 1; }

  /* Set mask array values for each solution component */
  N_VConst(0.0, umask);
  data = N_VGetArrayPointer(umask);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }
  for (i = 0; i < N; i++) { data[IDX(i, 0)] = SUN_RCONST(1.0); }

  N_VConst(0.0, vmask);
  data = N_VGetArrayPointer(vmask);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }
  for (i = 0; i < N; i++) { data[IDX(i, 1)] = SUN_RCONST(1.0); }

  N_VConst(0.0, wmask);
  data = N_VGetArrayPointer(wmask);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }
  for (i = 0; i < N; i++) { data[IDX(i, 2)] = SUN_RCONST(1.0); }

  /*
   * Create the fast integrator and set options
   */

  /* Initialize matrix and linear solver data structures */
  A = SUNBandMatrix(NEQ, 4, 4, ctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return 1; }

  LS = SUNLinSol_Band(y, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return 1; }

  /* Initialize the fast integrator. Specify the implicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(NULL, ff, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Attach user data to fast integrator */
  retval = ARKodeSetUserData(inner_arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, ARKODE_ARK324L2SA_DIRK_4_2_3, -1);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Specify fast tolerances */
  retval = ARKodeSStolerances(inner_arkode_mem, reltol, abstol);
  if (check_retval(&retval, "ARKodeSStolerances", 1)) { return 1; }

  /* Attach matrix and linear solver */
  retval = ARKodeSetLinearSolver(inner_arkode_mem, LS, A);
  if (check_retval(&retval, "ARKodeSetLinearSolver", 1)) { return 1; }

  /* Set the Jacobian routine */
  retval = ARKodeSetJacFn(inner_arkode_mem, Jf);
  if (check_retval(&retval, "ARKodeSetJacFn", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKStepCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKStepCreateMRIStepInnerStepper", 1))
  {
    return 1;
  }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Pass udata to user functions */
  retval = ARKodeSetUserData(arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* output spatial mesh to disk (add extra point for periodic BC) */
  FID = fopen("mesh.txt", "w");
  for (i = 0; i < N + 1; i++)
  {
    fprintf(FID, "  %.16" ESYM "\n", udata->dx * i);
  }
  fclose(FID);

  /* Open output stream for results, access data arrays */
  UFID = fopen("u.txt", "w");
  VFID = fopen("v.txt", "w");
  WFID = fopen("w.txt", "w");

  /* output initial condition to disk (extra output for periodic BC) */
  data = N_VGetArrayPointer(y);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }

  for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM, data[IDX(i, 0)]); }
  fprintf(UFID, " %.16" ESYM, data[IDX(0, 0)]);
  fprintf(UFID, "\n");

  for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM, data[IDX(i, 1)]); }
  fprintf(VFID, " %.16" ESYM, data[IDX(0, 1)]);
  fprintf(VFID, "\n");

  for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM, data[IDX(i, 2)]); }
  fprintf(WFID, " %.16" ESYM, data[IDX(0, 2)]);
  fprintf(WFID, "\n");

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration,
     then prints results.  Stops when the final time has been reached */
  t     = T0;
  dTout = (Tf - T0) / Nt;
  tout  = T0 + dTout;
  printf("        t      ||u||_rms   ||v||_rms   ||w||_rms\n");
  printf("   ----------------------------------------------\n");
  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* access/print solution statistics */
    u = N_VWL2Norm(y, umask);
    u = SUNRsqrt(u * u / N);
    v = N_VWL2Norm(y, vmask);
    v = SUNRsqrt(v * v / N);
    w = N_VWL2Norm(y, wmask);
    w = SUNRsqrt(w * w / N);
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           u, v, w);

    /* output results to disk (extr output for periodic BC) */
    for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM, data[IDX(i, 0)]); }
    fprintf(UFID, " %.16" ESYM, data[IDX(0, 0)]);
    fprintf(UFID, "\n");

    for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM, data[IDX(i, 1)]); }
    fprintf(VFID, " %.16" ESYM, data[IDX(0, 1)]);
    fprintf(VFID, "\n");

    for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM, data[IDX(i, 2)]); }
    fprintf(WFID, " %.16" ESYM, data[IDX(0, 2)]);
    fprintf(WFID, "\n");

    /* successful solve: update output time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);
  fclose(VFID);
  fclose(WFID);

  /* Get some slow integrator statistics */
  retval = ARKodeGetNumSteps(arkode_mem, &nsts);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = MRIStepGetNumRhsEvals(arkode_mem, &nfse, &nfsi);
  check_retval(&retval, "MRIStepGetNumRhsEvals", 1);

  /* Get some fast integrator statistics */
  retval = ARKodeGetNumSteps(inner_arkode_mem, &nstf);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumStepAttempts(inner_arkode_mem, &nstf_a);
  check_retval(&retval, "ARKodeGetNumStepAttempts", 1);
  retval = ARKStepGetNumRhsEvals(inner_arkode_mem, &nffe, &nffi);
  check_retval(&retval, "ARKStepGetNumRhsEvals", 1);
  retval = ARKodeGetNumLinSolvSetups(inner_arkode_mem, &nsetups);
  check_retval(&retval, "ARKodeGetNumLinSolvSetups", 1);
  retval = ARKodeGetNumErrTestFails(inner_arkode_mem, &netf);
  check_retval(&retval, "ARKodeGetNumErrTestFails", 1);
  retval = ARKodeGetNumNonlinSolvIters(inner_arkode_mem, &nni);
  check_retval(&retval, "ARKodeGetNumNonlinSolvIters", 1);
  retval = ARKodeGetNumNonlinSolvConvFails(inner_arkode_mem, &ncfn);
  check_retval(&retval, "ARKodeGetNumNonlinSolvConvFails", 1);
  retval = ARKodeGetNumJacEvals(inner_arkode_mem, &nje);
  check_retval(&retval, "ARKodeGetNumJacEvals", 1);
  retval = ARKodeGetNumLinRhsEvals(inner_arkode_mem, &nfeLS);
  check_retval(&retval, "ARKodeGetNumLinRhsEvals", 1);

  /* Print some final statistics */
  printf("\nFinal Solver Statistics:\n");
  printf("   Slow Steps: nsts = %li\n", nsts);
  printf("   Fast Steps: nstf = %li (attempted = %li)\n", nstf, nstf_a);
  printf("   Total RHS evals:  Fs = %li,  Ff = %li\n", nfse, nffi);
  printf("   Total number of fast error test failures = %li\n", netf);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n",
         ncfn);

  /* Clean up and return with successful completion */
  free(udata);                              /* Free user data         */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  SUNLinSolFree(LS);                        /* Free linear solver     */
  SUNMatDestroy(A);                         /* Free matrix            */
  N_VDestroy(y);                            /* Free vectors           */
  N_VDestroy(umask);
  N_VDestroy(vmask);
  N_VDestroy(wmask);
  SUNContext_Free(&ctx); /* Free context */

  return 0;
}